

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

void secp256k1_musig_ge_serialize_ext(uchar *out33,secp256k1_ge *ge)

{
  int iVar1;
  uchar *b32;
  uchar *puVar2;
  secp256k1_ge *psVar3;
  size_t size;
  int iStack_4c;
  secp256k1_scalar sStack_48;
  uchar *puStack_28;
  secp256k1_ge *psStack_20;
  size_t local_18;
  
  psStack_20 = (secp256k1_ge *)0x125cd7;
  secp256k1_ge_verify(ge);
  if (ge->infinity != 0) {
    out33[0x10] = '\0';
    out33[0x11] = '\0';
    out33[0x12] = '\0';
    out33[0x13] = '\0';
    out33[0x14] = '\0';
    out33[0x15] = '\0';
    out33[0x16] = '\0';
    out33[0x17] = '\0';
    out33[0x18] = '\0';
    out33[0x19] = '\0';
    out33[0x1a] = '\0';
    out33[0x1b] = '\0';
    out33[0x1c] = '\0';
    out33[0x1d] = '\0';
    out33[0x1e] = '\0';
    out33[0x1f] = '\0';
    out33[0] = '\0';
    out33[1] = '\0';
    out33[2] = '\0';
    out33[3] = '\0';
    out33[4] = '\0';
    out33[5] = '\0';
    out33[6] = '\0';
    out33[7] = '\0';
    out33[8] = '\0';
    out33[9] = '\0';
    out33[10] = '\0';
    out33[0xb] = '\0';
    out33[0xc] = '\0';
    out33[0xd] = '\0';
    out33[0xe] = '\0';
    out33[0xf] = '\0';
    out33[0x20] = '\0';
    return;
  }
  local_18 = 0x21;
  psStack_20 = (secp256k1_ge *)0x125d08;
  puVar2 = out33;
  psVar3 = ge;
  iVar1 = secp256k1_eckey_pubkey_serialize(ge,out33,&local_18,1);
  if ((iVar1 != 0) && (local_18 == 0x21)) {
    return;
  }
  psStack_20 = (secp256k1_ge *)secp256k1_musig_partial_sig_parse;
  secp256k1_musig_ge_serialize_ext_cold_1();
  puStack_28 = out33;
  psStack_20 = ge;
  if (psVar3 == (secp256k1_ge *)0x0) {
    secp256k1_musig_partial_sig_parse_cold_3();
  }
  else if (puVar2 != (uchar *)0x0) {
    if (b32 == (uchar *)0x0) {
      secp256k1_musig_partial_sig_parse_cold_1();
      return;
    }
    puVar2[0x10] = '\0';
    puVar2[0x11] = '\0';
    puVar2[0x12] = '\0';
    puVar2[0x13] = '\0';
    puVar2[0x14] = '\0';
    puVar2[0x15] = '\0';
    puVar2[0x16] = '\0';
    puVar2[0x17] = '\0';
    puVar2[0x18] = '\0';
    puVar2[0x19] = '\0';
    puVar2[0x1a] = '\0';
    puVar2[0x1b] = '\0';
    puVar2[0x1c] = '\0';
    puVar2[0x1d] = '\0';
    puVar2[0x1e] = '\0';
    puVar2[0x1f] = '\0';
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2[4] = '\0';
    puVar2[5] = '\0';
    puVar2[6] = '\0';
    puVar2[7] = '\0';
    puVar2[8] = '\0';
    puVar2[9] = '\0';
    puVar2[10] = '\0';
    puVar2[0xb] = '\0';
    puVar2[0xc] = '\0';
    puVar2[0xd] = '\0';
    puVar2[0xe] = '\0';
    puVar2[0xf] = '\0';
    puVar2[0x20] = '\0';
    puVar2[0x21] = '\0';
    puVar2[0x22] = '\0';
    puVar2[0x23] = '\0';
    secp256k1_scalar_set_b32(&sStack_48,b32,&iStack_4c);
    if (iStack_4c != 0) {
      return;
    }
    puVar2[0] = 0xeb;
    puVar2[1] = 0xfb;
    puVar2[2] = '\x1a';
    puVar2[3] = '2';
    secp256k1_scalar_get_b32(puVar2 + 4,&sStack_48);
    return;
  }
  secp256k1_musig_partial_sig_parse_cold_2();
  return;
}

Assistant:

static void secp256k1_musig_ge_serialize_ext(unsigned char *out33, secp256k1_ge* ge) {
    if (secp256k1_ge_is_infinity(ge)) {
        memset(out33, 0, 33);
    } else {
        int ret;
        size_t size = 33;
        ret = secp256k1_eckey_pubkey_serialize(ge, out33, &size, 1);
#ifdef VERIFY
        /* Serialize must succeed because the point is not at infinity */
        VERIFY_CHECK(ret && size == 33);
#else
        (void) ret;
#endif
    }
}